

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void lodepng::convertFromXYZ_gamma
               (float *im,uint w,uint h,LodePNGInfo *info,uint use_icc,LodePNGICC *icc)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  uVar10 = (ulong)(w * h);
  if (use_icc == 0) {
    if ((info->gama_defined == 0) || (info->srgb_defined != 0)) {
      for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          fVar14 = im[lVar12];
          if (0.0031308 <= fVar14) {
            fVar14 = lodepng_powf(fVar14,0.41666666);
            fVar14 = fVar14 * 1.055 + -0.055;
          }
          else {
            fVar14 = fVar14 * 12.92;
          }
          im[lVar12] = fVar14;
        }
        im = im + 4;
      }
    }
    else {
      uVar2 = info->gama_gamma;
      if (uVar2 != 100000) {
        for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            if (0.0 < im[lVar12]) {
              fVar14 = lodepng_powf(im[lVar12],(float)uVar2 / 100000.0);
              im[lVar12] = fVar14;
            }
          }
          im = im + 4;
        }
      }
    }
  }
  else {
    for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
      for (uVar11 = 0; uVar11 != 3; uVar11 = uVar11 + 1) {
        uVar9 = uVar11 | uVar6 * 4;
        uVar2 = icc->trc[uVar11].type;
        if (uVar2 < 7) {
          fVar13 = im[uVar9];
          fVar14 = fVar13;
          switch(uVar2) {
          case 1:
            if ((0.0 < fVar13) && (fVar13 < 1.0)) {
              uVar4 = icc->trc[uVar11].lut_size;
              uVar7 = 0;
              while (uVar5 = uVar4, uVar7 != uVar5) {
                if (uVar7 + 1 == uVar5) {
                  pfVar3 = icc->trc[uVar11].lut;
                  fVar14 = pfVar3[uVar7];
                  fVar1 = pfVar3[uVar5];
                  if ((fVar14 != fVar1) || (NAN(fVar14) || NAN(fVar1))) {
                    fVar13 = (fVar13 - fVar14) / (fVar1 - fVar14);
                    fVar14 = fVar13 * fVar1 + (1.0 - fVar13) * fVar14;
                  }
                  goto switchD_0011a92a_caseD_0;
                }
                uVar8 = uVar7 + uVar5 >> 1;
                uVar4 = uVar8;
                if (icc->trc[uVar11].lut[uVar8] <= fVar13) {
                  uVar4 = uVar5;
                  uVar7 = uVar8;
                }
              }
              fVar14 = icc->trc[uVar11].lut[uVar5];
            }
            break;
          case 2:
            if (0.0 < fVar13) {
              fVar14 = lodepng_powf(fVar13,1.0 / icc->trc[uVar11].gamma);
            }
            break;
          case 3:
            if (0.0 <= fVar13) {
              if (0.0 < fVar13) goto LAB_0011aa20;
LAB_0011a9cf:
              fVar14 = -icc->trc[uVar11].b;
              goto LAB_0011aa43;
            }
            break;
          case 4:
            if (0.0 <= fVar13) {
              fVar14 = icc->trc[uVar11].c;
              if (fVar13 <= fVar14) goto LAB_0011a9cf;
              goto LAB_0011aa1c;
            }
            break;
          case 5:
            fVar14 = icc->trc[uVar11].c;
            if (icc->trc[uVar11].d * fVar14 < fVar13) goto LAB_0011aa20;
LAB_0011aa4f:
            fVar14 = fVar13 / fVar14;
            break;
          case 6:
            fVar14 = icc->trc[uVar11].c;
            fVar1 = icc->trc[uVar11].f;
            if (fVar13 <= icc->trc[uVar11].d * fVar14 + fVar1) {
              fVar13 = fVar13 - fVar1;
              goto LAB_0011aa4f;
            }
LAB_0011aa1c:
            fVar13 = fVar13 - fVar14;
LAB_0011aa20:
            fVar14 = lodepng_powf(fVar13,1.0 / icc->trc[uVar11].gamma);
            fVar14 = fVar14 - icc->trc[uVar11].b;
LAB_0011aa43:
            fVar14 = fVar14 / icc->trc[uVar11].a;
          }
        }
        else {
          fVar14 = 0.0;
        }
switchD_0011a92a_caseD_0:
        im[uVar9] = fVar14;
      }
    }
  }
  return;
}

Assistant:

static void convertFromXYZ_gamma(float* im, unsigned w, unsigned h,
                                 const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc) {
  size_t i, c;
  size_t n = w * h;
  if(use_icc) {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* TODO: this is likely very slow */
        im[i * 4 + c] = iccBackwardTRC(&icc->trc[c], im[i * 4 + c]);
      }
    }
  } else if(info->gama_defined && !info->srgb_defined) {
    /* nothing to do if gamma is 1 */
    if(info->gama_gamma != 100000) {
      float gamma = info->gama_gamma / 100000.0f;
      for(i = 0; i < n; i++) {
        for(c = 0; c < 3; c++) {
          if(im[i * 4 + c] > 0) im[i * 4 + c] = lodepng_powf(im[i * 4 + c], gamma);
        }
      }
    }
  } else {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* sRGB gamma compress */
        float* v = &im[i * 4 + c];
        *v = (*v < 0.0031308f) ? (*v * 12.92f) : (1.055f * lodepng_powf(*v, 1 / 2.4f) - 0.055f);
      }
    }
  }
}